

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.h
# Opt level: O1

size_t __thiscall ON_SubDHeap::SizeOfAllPools(ON_SubDHeap *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  
  sVar1 = ON_FixedSizePool::SizeOfPool(&this->m_fspv);
  sVar2 = ON_FixedSizePool::SizeOfPool(&this->m_fspe);
  sVar3 = ON_FixedSizePool::SizeOfPool(&this->m_fspf);
  sVar4 = ON_FixedSizePool::SizeOfPool(&this->m_fsp5);
  sVar5 = ON_FixedSizePool::SizeOfPool(&this->m_fsp9);
  sVar6 = ON_FixedSizePool::SizeOfPool(&this->m_fsp17);
  sVar7 = ON_FixedSizePool::SizeOfPool(&this->m_fsp_full_fragments);
  sVar8 = ON_FixedSizePool::SizeOfPool(&this->m_fsp_part_fragments);
  sVar9 = ON_FixedSizePool::SizeOfPool(&this->m_fsp_oddball_fragments);
  sVar10 = ON_FixedSizePool::SizeOfPool(&this->m_fsp_limit_curves);
  return sVar10 + sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + sVar4 + sVar3 + sVar2 + sVar1;
}

Assistant:

size_t SizeOfAllPools() const
  {
    size_t sz = 0;
    sz += m_fspv.SizeOfPool();
    sz += m_fspe.SizeOfPool();
    sz += m_fspf.SizeOfPool();
    sz += m_fsp5.SizeOfPool();
    sz += m_fsp9.SizeOfPool();
    sz += m_fsp17.SizeOfPool();
    sz += m_fsp_full_fragments.SizeOfPool();
    sz += m_fsp_part_fragments.SizeOfPool();
    sz += m_fsp_oddball_fragments.SizeOfPool();
    sz += m_fsp_limit_curves.SizeOfPool();
    return sz;
  }